

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O3

void __thiscall Face::build_map(Face *this,Corner reference_corner,Eq_Pos_Table *eq_pos_table)

{
  long lVar1;
  Color *pCVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  vector<Position,_std::allocator<Position>_> eq_positions;
  long local_90;
  pair<Position,_Color_*> local_88;
  Color *local_70;
  Face *local_68;
  Eq_Pos_Table *local_60;
  long local_58;
  long local_50;
  vector<Position,_std::allocator<Position>_> local_48;
  
  local_70 = this->color_data;
  local_90 = 1;
  lVar6 = 0;
  local_68 = this;
  local_60 = eq_pos_table;
  do {
    local_50 = lVar6 * lVar6;
    lVar5 = 0;
    local_58 = lVar6;
    do {
      lVar1 = local_50 + lVar5;
      Eq_Pos_Table::get_equivalent_positions(&local_48,local_60,local_68->center_color,(int)lVar1);
      pCVar2 = local_70 + lVar1;
      local_88.first.layer = (int)lVar6;
      local_88.first.reference_corner = reference_corner;
      local_88.first.entry = (int)lVar5;
      local_88.second = pCVar2;
      std::
      _Rb_tree<Position,std::pair<Position_const,Color*>,std::_Select1st<std::pair<Position_const,Color*>>,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
      ::_M_emplace_unique<std::pair<Position,Color*>>
                ((_Rb_tree<Position,std::pair<Position_const,Color*>,std::_Select1st<std::pair<Position_const,Color*>>,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
                  *)&this->current_state,&local_88);
      if (local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar6 = 0;
        uVar4 = 0;
        do {
          local_88.first.entry =
               *(int *)((long)&(local_48.super__Vector_base<Position,_std::allocator<Position>_>.
                                _M_impl.super__Vector_impl_data._M_start)->entry + lVar6);
          local_88.first._0_8_ =
               *(undefined8 *)
                ((long)&(local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                         super__Vector_impl_data._M_start)->reference_corner + lVar6);
          local_88.second = pCVar2;
          std::
          _Rb_tree<Position,std::pair<Position_const,Color*>,std::_Select1st<std::pair<Position_const,Color*>>,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
          ::_M_emplace_unique<std::pair<Position,Color*>>
                    ((_Rb_tree<Position,std::pair<Position_const,Color*>,std::_Select1st<std::pair<Position_const,Color*>>,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
                      *)&this->current_state,&local_88);
          uVar4 = uVar4 + 1;
          uVar3 = ((long)local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
          lVar6 = lVar6 + 0xc;
        } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
      }
      lVar6 = local_58;
      if (local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != local_90);
    lVar6 = lVar6 + 1;
    local_90 = local_90 + 2;
  } while (lVar6 != 4);
  return;
}

Assistant:

void Face::build_map(Corner reference_corner, Eq_Pos_Table& eq_pos_table){
    Position current_position;
    current_position.reference_corner = reference_corner;
    for(int layer = 0; layer < 4; layer++){
        current_position.layer = layer;
        for(int entry = 0; entry < (2*layer + 1); entry++){
            current_position.entry = entry;
            int flat_entry = (layer*layer) + entry;
            std::vector<Position> eq_positions = eq_pos_table.get_equivalent_positions(center_color, flat_entry);
            current_state.insert(std::pair<Position, Color*>(current_position, &color_data[flat_entry]));
            for(int i = 0; i < eq_positions.size(); i++){
                current_state.insert(std::pair<Position, Color*>(eq_positions[i], &color_data[flat_entry]));
            }
        }
    }
}